

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

void __thiscall
compiler::CompilerAstWalker::onExitWhileStatementAstNode
          (CompilerAstWalker *this,WhileStatementAstNode *param_1)

{
  size_t sVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  size_type sVar5;
  reference pvVar6;
  pointer ppVar7;
  element_type *this_00;
  reference puVar8;
  unsigned_long breakIndex;
  iterator __end3;
  iterator __begin3;
  element_type *__range3;
  size_t loopEnd;
  undefined1 local_90 [8];
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> vec;
  iterator find;
  size_t loopJumpIfFalseIndex;
  size_t loopStartIndex;
  string local_60;
  allocator<char> local_39;
  string local_38;
  WhileStatementAstNode *local_18;
  WhileStatementAstNode *param_1_local;
  CompilerAstWalker *this_local;
  
  local_18 = param_1;
  param_1_local = (WhileStatementAstNode *)this;
  peVar3 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    (&peVar3->loopStartIndices);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "onExitWhileStatementAstNode encountered while exit statement but loopStartIndices is empty"
             ,&local_39);
  Error::assertWithPanic(!bVar2,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  peVar3 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    (&peVar3->loopConditionEvalJumpIndices);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             "onExitWhileStatementAstNode encountered while exit statement but loopConditionEvalJumpIndices is empty"
             ,(allocator<char> *)((long)&loopStartIndex + 7));
  Error::assertWithPanic(!bVar2,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)((long)&loopStartIndex + 7));
  peVar3 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  peVar4 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    (&peVar4->loopStartIndices);
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     (&peVar3->loopStartIndices,sVar5 - 1);
  loopJumpIfFalseIndex = *pvVar6;
  peVar3 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  peVar4 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    (&peVar4->loopConditionEvalJumpIndices);
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     (&peVar3->loopConditionEvalJumpIndices,sVar5 - 1);
  sVar1 = *pvVar6;
  peVar3 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  vec.
  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       unordered_map<unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
       ::find(&peVar3->breakStatementsForLoops,&loopJumpIfFalseIndex);
  std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::shared_ptr
            ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_90,
             (nullptr_t)0x0);
  peVar3 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  loopEnd = (size_t)std::
                    unordered_map<unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                    ::end(&peVar3->breakStatementsForLoops);
  bVar2 = std::__detail::operator!=
                    ((_Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
                      *)&vec.
                         super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount,
                     (_Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
                      *)&loopEnd);
  if (bVar2) {
    ppVar7 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false,_false>
                           *)&vec.
                              super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::operator=
              ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_90,
               &ppVar7->second);
  }
  emit(this,Jump,loopJumpIfFalseIndex);
  peVar3 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  sVar5 = std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::size
                    (&peVar3->byteCode);
  peVar3 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  EmissionContext::UpdateParameterAtIndex(peVar3,sVar1,sVar5);
  bVar2 = std::operator!=((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *
                          )local_90,(nullptr_t)0x0);
  if (bVar2) {
    this_00 = std::
              __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_90);
    __end3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(this_00);
    breakIndex = (unsigned_long)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&breakIndex), bVar2) {
      puVar8 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end3);
      sVar1 = *puVar8;
      peVar3 = std::
               __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->ec);
      EmissionContext::UpdateParameterAtIndex(peVar3,sVar1,sVar5);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end3);
    }
  }
  peVar3 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&peVar3->loopStartIndices);
  peVar3 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
            (&peVar3->loopConditionEvalJumpIndices);
  std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~shared_ptr
            ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_90);
  return;
}

Assistant:

void onExitWhileStatementAstNode(WhileStatementAstNode*  /*node*/) noexcept override {
    Error::assertWithPanic(!this->ec->loopStartIndices.empty(),
      "onExitWhileStatementAstNode encountered while exit statement but loopStartIndices is empty");

    Error::assertWithPanic(!this->ec->loopConditionEvalJumpIndices.empty(),
      "onExitWhileStatementAstNode encountered while exit statement but loopConditionEvalJumpIndices is empty");

    std::size_t loopStartIndex = this->ec->loopStartIndices.at(this->ec->loopStartIndices.size() - 1);
    std::size_t loopJumpIfFalseIndex = this->ec->loopConditionEvalJumpIndices.at(this->ec->loopConditionEvalJumpIndices.size() - 1);

    auto find = this->ec->breakStatementsForLoops.find(loopStartIndex);

    std::shared_ptr<std::vector<std::size_t>> vec = nullptr;

    if (find != this->ec->breakStatementsForLoops.end()) {
      vec = find->second;
    }

    this->emit(bytecode::ByteCodeInstruction::Jump, loopStartIndex);

    std::size_t loopEnd = this->ec->byteCode.size();

    this->ec->UpdateParameterAtIndex(loopJumpIfFalseIndex, loopEnd);

    if (vec != nullptr) {
      for (const auto breakIndex : *vec) {
        this->ec->UpdateParameterAtIndex(breakIndex, loopEnd);
      }
    }

    this->ec->loopStartIndices.pop_back();
    this->ec->loopConditionEvalJumpIndices.pop_back();
  }